

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int32_t __thiscall
icu_63::PluralRules::getSamples
          (PluralRules *this,UnicodeString *keyword,double *dest,int32_t destCapacity,
          UErrorCode *status)

{
  UBool UVar1;
  RuleChain *pRVar2;
  int32_t local_44;
  int32_t numSamples;
  RuleChain *rc;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  double *dest_local;
  UnicodeString *keyword_local;
  PluralRules *this_local;
  
  if ((destCapacity == 0) || (UVar1 = ::U_FAILURE(*status), UVar1 != '\0')) {
    return 0;
  }
  UVar1 = ::U_FAILURE(this->mInternalStatus);
  if (UVar1 != '\0') {
    *status = this->mInternalStatus;
    return 0;
  }
  pRVar2 = rulesForKeyword(this,keyword);
  if (pRVar2 == (RuleChain *)0x0) {
    return 0;
  }
  local_44 = getSamplesFromString(&pRVar2->fIntegerSamples,dest,destCapacity,status);
  if (local_44 == 0) {
    local_44 = getSamplesFromString(&pRVar2->fDecimalSamples,dest,destCapacity,status);
  }
  return local_44;
}

Assistant:

int32_t
PluralRules::getSamples(const UnicodeString &keyword, double *dest,
                        int32_t destCapacity, UErrorCode& status) {
    if (destCapacity == 0 || U_FAILURE(status)) {
        return 0;
    }
    if (U_FAILURE(mInternalStatus)) {
        status = mInternalStatus;
        return 0;
    }
    RuleChain *rc = rulesForKeyword(keyword);
    if (rc == nullptr) {
        return 0;
    }
    int32_t numSamples = getSamplesFromString(rc->fIntegerSamples, dest, destCapacity, status);
    if (numSamples == 0) {
        numSamples = getSamplesFromString(rc->fDecimalSamples, dest, destCapacity, status);
    }
    return numSamples;
}